

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

void __thiscall
pstore::broker::command_processor::command_processor
          (command_processor *this,uint num_read_threads,
          not_null<pstore::maybe<pstore::http::server_status,_void>_*> http_status,
          not_null<std::atomic<bool>_*> uptime_done,seconds delete_threshold)

{
  bool bVar1;
  const_iterator __first;
  const_iterator __last;
  uint num_read_threads_local;
  command_processor *this_local;
  seconds delete_threshold_local;
  not_null<std::atomic<bool>_*> uptime_done_local;
  not_null<pstore::maybe<pstore::http::server_status,_void>_*> http_status_local;
  
  this->_vptr_command_processor = (_func_int **)&PTR__command_processor_002440d0;
  std::atomic<bool>::atomic(&this->commands_done_,false);
  (this->http_status_).ptr_ = http_status.ptr_;
  (this->uptime_done_).ptr_ = uptime_done.ptr_;
  (this->delete_threshold_).__r = delete_threshold.__r;
  atomic_weak_ptr<pstore::broker::scavenger>::atomic_weak_ptr(&this->scavenger_);
  message_queue<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>
  ::message_queue(&this->messages_);
  std::mutex::mutex(&this->cmds_mut_);
  std::
  unordered_map<std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces,_std::hash<std::pair<unsigned_long,_unsigned_long>_>,_std::equal_to<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>_>_>
  ::unordered_map(&this->cmds_);
  this->num_read_threads_ = num_read_threads;
  this->commits_ = 0;
  __first = std::
            begin<std::array<std::tuple<char_const*,std::function<void(pstore::broker::command_processor*,pstore::brokerface::fifo_path_const&,pstore::broker::broker_command_const&)>>,6ul>>
                      ((array<std::tuple<const_char_*,_std::function<void_(pstore::broker::command_processor_*,_const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>_>,_6UL>
                        *)commands_);
  __last = std::
           end<std::array<std::tuple<char_const*,std::function<void(pstore::broker::command_processor*,pstore::brokerface::fifo_path_const&,pstore::broker::broker_command_const&)>>,6ul>>
                     ((array<std::tuple<const_char_*,_std::function<void_(pstore::broker::command_processor_*,_const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>_>,_6UL>
                       *)commands_);
  bVar1 = std::
          is_sorted<std::tuple<char_const*,std::function<void(pstore::broker::command_processor*,pstore::brokerface::fifo_path_const&,pstore::broker::broker_command_const&)>>const*,bool(*)(std::tuple<char_const*,std::function<void(pstore::broker::command_processor*,pstore::brokerface::fifo_path_const&,pstore::broker::broker_command_const&)>>const&,std::tuple<char_const*,std::function<void(pstore::broker::command_processor*,pstore::brokerface::fifo_path_const&,pstore::broker::broker_command_const&)>>const&)>
                    (__first,__last,command_entry_compare);
  if (!bVar1) {
    assert_failed("std::is_sorted (std::begin (commands_), std::end (commands_), command_entry_compare)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/broker/command.cpp"
                  ,0x4d);
  }
  return;
}

Assistant:

command_processor::command_processor (
            unsigned const num_read_threads,
            gsl::not_null<maybe<http::server_status> *> const http_status,
            gsl::not_null<std::atomic<bool> *> const uptime_done,
            std::chrono::seconds const delete_threshold)
                : http_status_{http_status}
                , uptime_done_{uptime_done}
                , delete_threshold_{delete_threshold}
                , num_read_threads_{num_read_threads} {
            PSTORE_ASSERT (std::is_sorted (std::begin (commands_), std::end (commands_),
                                           command_entry_compare));
        }